

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UText * utext_openUTF8_63(UText *ut,char *s,int64_t length,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  int64_t length_local;
  char *s_local;
  UText *ut_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    length_local = (int64_t)s;
    if ((s == (char *)0x0) && (length == 0)) {
      length_local = (int64_t)gEmptyString;
    }
    if (((length_local == 0) || (length < -1)) || (0x7fffffff < length)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      ut_local = (UText *)0x0;
    }
    else {
      ut_local = utext_setup_63(ut,0x1e0,status);
      UVar1 = U_FAILURE(*status);
      if (UVar1 == '\0') {
        ut_local->pFuncs = &utf8Funcs;
        ut_local->context = (void *)length_local;
        ut_local->b = (int32_t)length;
        ut_local->c = (int32_t)length;
        if (ut_local->c < 0) {
          ut_local->c = 0;
          ut_local->providerProperties = ut_local->providerProperties | 2;
        }
        ut_local->p = ut_local->pExtra;
        ut_local->q = (void *)((long)ut_local->pExtra + 0xf0);
      }
    }
  }
  else {
    ut_local = (UText *)0x0;
  }
  return ut_local;
}

Assistant:

U_CAPI UText * U_EXPORT2
utext_openUTF8(UText *ut, const char *s, int64_t length, UErrorCode *status) {
    if(U_FAILURE(*status)) {
        return NULL;
    }
    if(s==NULL && length==0) {
        s = gEmptyString;
    }

    if(s==NULL || length<-1 || length>INT32_MAX) {
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    ut = utext_setup(ut, sizeof(UTF8Buf) * 2, status);
    if (U_FAILURE(*status)) {
        return ut;
    }

    ut->pFuncs  = &utf8Funcs;
    ut->context = s;
    ut->b       = (int32_t)length;
    ut->c       = (int32_t)length;
    if (ut->c < 0) {
        ut->c = 0;
        ut->providerProperties |= I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
    }
    ut->p = ut->pExtra;
    ut->q = (char *)ut->pExtra + sizeof(UTF8Buf);
    return ut;

}